

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_bias_test.cc
# Opt level: O2

void intgemm::kernel_add_bias_test<(intgemm::CPUType)4,int>(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  int local_104 [3];
  AlignedVector<int> output;
  AlignedVector<int> bias;
  AlignedVector<int> input;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_int_&,_const_int_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (3 < kCPU) {
    AlignedVector<int>::AlignedVector(&input,0x10,0x40);
    AlignedVector<int>::AlignedVector(&bias,0x10,0x40);
    AlignedVector<int>::AlignedVector(&output,0x10,0x40);
    lVar2 = 0;
    for (lVar1 = input.size_ << 2; lVar1 != 0; lVar1 = lVar1 + -4) {
      input.mem_[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
    }
    for (lVar1 = 0; bias.size_ << 2 != lVar1; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)bias.mem_ + lVar1) = 100;
    }
    auVar4 = vmovdqa64_avx512f(*(undefined1 (*) [64])bias.mem_);
    auVar4 = vpaddd_avx512f(auVar4,*(undefined1 (*) [64])input.mem_);
    auVar4 = vmovdqa64_avx512f(auVar4);
    *(undefined1 (*) [64])output.mem_ = auVar4;
    lVar1 = 0;
    for (uVar3 = 0; uVar3 < output.size_; uVar3 = uVar3 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/add_bias_test.cc"
      ;
      local_c8.line = 0x1d;
      Catch::StringRef::StringRef(&local_b8,"output[i] == ElemType_(100 + i)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = (char *)((long)output.mem_ + lVar1);
      local_104[0] = (int)uVar3 + 100;
      Catch::ExprLhs<int_const&>::operator==(&local_a8,(ExprLhs<int_const&> *)&local_c8,local_104);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      lVar1 = lVar1 + 4;
    }
    free(output.mem_);
    free(bias.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_add_bias_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static auto VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> bias(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));
  std::fill(bias.begin(), bias.end(), static_cast<ElemType_>(100));

  *output.template as<vec_t>() = kernels::add_bias(*input.template as<vec_t>(), bias.begin(), 0);
  for (std::size_t i = 0; i < output.size(); ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == static_cast<ElemType_>(bias[i] + input[i])); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(100 + i));
#endif
}